

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O2

void ur_pp(double *y,int N,char *alternative,char *type,int lshort,int *klag,double *statistic,
          double *pval)

{
  size_t __size;
  double dVar1;
  double dVar2;
  int iVar3;
  double *y_00;
  void *__src;
  double *x;
  double *res;
  double *xin;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  reg_object obj;
  int iVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  char *__s;
  uint uVar11;
  ulong uVar12;
  double *yin;
  bool bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_438;
  double dftable_at [48];
  double dftable [48];
  double prob [8];
  double local_58;
  double local_50;
  int local_44;
  double local_40;
  double local_38;
  
  prob[7] = 25.0;
  prob[5] = 0.975;
  prob[6] = 0.99;
  prob[3] = 0.9;
  prob[4] = 0.95;
  prob[1] = 0.05;
  prob[2] = 0.1;
  dftable[0x2f] = 0.01;
  prob[0] = 0.025;
  yin = &local_438;
  local_44 = lshort;
  memcpy(yin,&DAT_00151160,0x180);
  memcpy(dftable_at + 0x2f,&DAT_001512e0,0x180);
  lVar10 = (long)N;
  local_38 = (double)(lVar10 + -1);
  uVar11 = N - 1;
  local_50 = (double)(ulong)(uVar11 * uVar11);
  local_40 = (double)((long)local_38 * 0x10);
  y_00 = (double *)malloc((size_t)local_40);
  __size = lVar10 * 8 - 8;
  __src = malloc(__size);
  x = (double *)malloc((size_t)local_40);
  res = (double *)malloc(__size);
  xin = (double *)malloc(0x40);
  uVar4 = 0;
  uVar12 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar12 = uVar4;
  }
  pdVar6 = y + 1;
  pdVar8 = y_00;
  for (; uVar4 != 2; uVar4 = uVar4 + 1) {
    for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
      pdVar8[uVar9] = pdVar6[uVar9];
    }
    pdVar8 = pdVar8 + lVar10 + -1;
    pdVar6 = pdVar6 + -1;
  }
  local_40 = (double)SUB84(local_38,0);
  iVar3 = SUB84(local_50,0) * SUB84(local_38,0);
  for (lVar5 = 1; lVar5 < lVar10; lVar5 = lVar5 + 1) {
    *(double *)((long)__src + lVar5 * 8 + -8) = (double)(int)lVar5 - local_40 * 0.5;
  }
  pdVar8 = y_00 + (long)local_38;
  pdVar6 = (double *)malloc(0x48);
  memcpy(x,__src,__size);
  memcpy(x + (long)local_38,pdVar8,__size);
  obj = reg_init(SUB84(local_38,0),3);
  regress(obj,x,y_00,res,pdVar6,0.95);
  dVar15 = 0.0;
  for (uVar4 = 0; uVar12 != uVar4; uVar4 = uVar4 + 1) {
    dVar15 = dVar15 + res[uVar4] * res[uVar4];
  }
  dVar15 = dVar15 / local_40;
  bVar13 = local_44 == 1;
  local_58 = dVar15;
  dVar1 = pow(local_40 / 100.0,0.25);
  local_44 = (int)(dVar1 * *(double *)(&DAT_00150c78 + (ulong)bVar13 * 8));
  if ((klag != (int *)0x0) && (0 < *klag)) {
    local_44 = *klag;
  }
  ppsum(res,SUB84(local_38,0),local_44,&local_58);
  dVar1 = 0.0;
  uVar4 = 0;
  dVar14 = 0.0;
  dVar16 = 0.0;
  while (uVar12 != uVar4) {
    dVar17 = pdVar8[uVar4];
    dVar1 = dVar1 + dVar17;
    uVar4 = uVar4 + 1;
    dVar14 = dVar14 + dVar17 * dVar17;
    dVar16 = dVar16 + (double)(int)uVar4 * dVar17;
  }
  iVar7 = N * SUB84(local_38,0);
  local_38 = ((double)((SUB84(local_38,0) * 2 + 1) * iVar7) * dVar1 * dVar1) / -6.0 +
             (double)iVar7 * dVar16 * dVar1 +
             ((dVar14 * (double)((SUB84(local_50,0) + -1) * SUB84(local_50,0))) / 12.0 -
             dVar16 * local_40 * dVar16);
  iVar7 = strcmp(type,"Z(alpha)");
  if (iVar7 == 0) {
    dVar1 = (double)iVar3;
    dVar15 = (obj[1].sigma_upper + -1.0) * local_40 +
             (dVar1 / (local_38 * -24.0)) * (local_58 - dVar15) * dVar1;
    yin = dftable_at + 0x2f;
  }
  else {
    iVar7 = strcmp(type,"Z(t_alpha)");
    if (iVar7 != 0) {
      __s = " Type only admits two values : Z(alpha) and Z(t_alpha) ";
      goto LAB_00144b8e;
    }
    dVar1 = obj[1].sigma_upper;
    dVar14 = obj[1].R2[0];
    if (dVar15 < 0.0) {
      local_50 = sqrt(dVar15);
    }
    else {
      local_50 = SQRT(dVar15);
    }
    if (local_58 < 0.0) {
      dVar16 = sqrt(local_58);
    }
    else {
      dVar16 = SQRT(local_58);
    }
    dVar17 = local_38;
    if (local_38 < 0.0) {
      local_38 = dVar16;
      dVar17 = sqrt(dVar17);
      dVar16 = local_38;
    }
    else {
      dVar17 = SQRT(local_38);
    }
    if (local_58 < 0.0) {
      local_50 = local_50 / dVar16;
      local_38 = dVar17 * 6.928203230275509;
      dVar2 = sqrt(local_58);
      dVar16 = local_50;
      dVar17 = local_38;
    }
    else {
      dVar2 = SQRT(local_58);
      dVar16 = local_50 / dVar16;
      dVar17 = dVar17 * 6.928203230275509;
    }
    dVar15 = dVar16 * ((dVar1 + -1.0) / dVar14) -
             (local_58 - dVar15) * ((double)iVar3 / (dVar17 * dVar2));
  }
  *statistic = dVar15;
  if (klag != (int *)0x0) {
    *klag = local_44;
  }
  for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
    dVar15 = interpolate_linear(prob + 7,yin,6,local_40);
    xin[lVar10] = dVar15;
    yin = yin + 6;
  }
  local_40 = interpolate_linear(xin,dftable + 0x2f,8,*statistic);
  iVar3 = strcmp(alternative,"stationary");
  dVar15 = local_40;
  if (iVar3 != 0) {
    iVar3 = strcmp(alternative,"explosive");
    if (iVar3 != 0) {
      __s = "alternative accepts only two values - stationary and explosive ";
LAB_00144b8e:
      puts(__s);
      exit(-1);
    }
    dVar15 = 1.0 - local_40;
  }
  *pval = dVar15;
  free_reg(obj);
  free(y_00);
  free(__src);
  free(x);
  free(pdVar6);
  free(res);
  free(xin);
  return;
}

Assistant:

void ur_pp(double *y, int N,const char* alternative,const char* type,int lshort, int *klag, double *statistic,double *pval) {
    /*
    y - Time Series data of length N
    alternative - "stationary" or "explosive"
    type - "Z(alpha)" or "Z(t_alpha)"
    lshort - determines the length of lag used. lshort = 1 => lag = 4.0 * pow(((double) N)/100.0,0.25)
    else lag = 12.0 * pow(((double) N)/100.0,0.25). It can be bypassed by parameter klag
    klag - Length of the lag. Set it to > 0 instead of NULL if you wnat it to bypass lshort. Set it to NULL or negative otherwise

    Outputs

    statistic - Test statistic
    pval - p-value used to determine null hypothesis

    */
    int i,j,N1,N2,p,l,pN,tN,iter;
    double *z,*yt,*yt1,*tt,*XX,*varcovar,*res,*table,*tablep;
    double at,nssqr_res,trm1,trm2,trm3,trm4,dx,alpha,s2,tstat;
    double sum_yt1,sum_yt12,sum_yt1n,interp;
    long int N3;
    reg_object fit;

    double nT[6] = {25, 50, 100, 250, 500, 100000};
    double prob[8] ={0.01, 0.025, 0.05, 0.10, 0.90, 0.95, 0.975, 0.99};
    double dftable_at[48] = {-4.38, -4.15, -4.04, -3.99, -3.98, -3.96,-3.95, -3.80, -3.73, -3.69, -3.68, -3.66,-3.60, -3.50, -3.45,
     -3.43, -3.42, -3.41,-3.24, -3.18, -3.15, -3.13, -3.13, -3.12,-1.14, -1.19, -1.22, -1.23, -1.24, -1.25,-0.80, -0.87, -0.90, -0.92,
      -0.93, -0.94,-0.50, -0.58, -0.62, -0.64, -0.65, -0.66,-0.15, -0.24, -0.28, -0.31, -0.32, -0.33};// 8X6

    double dftable[48] = {-22.5, -25.7, -27.4, -28.4, -28.9, -29.5, -19.9, -22.4, -23.6, -24.4, -24.8, -25.1, -17.9, -19.8, -20.7,
     -21.3, -21.5, -21.8, -15.6, -16.8, -17.5, -18.0, -18.1, -18.3, -3.66, -3.71, -3.74, -3.75, -3.76, -3.77, -2.51, -2.60, -2.62, 
     -2.64, -2.65, -2.66, -1.53, -1.66, -1.73, -1.78, -1.78, -1.79, -0.43, -0.65, -0.75, -0.82, -0.84, -0.87};// 8X6

    N1 = N - 1;
    N2 = N1 * N1;
    N3 = N2 * N1;

    pN = 8;
    tN = 6;

    z = (double*)malloc(sizeof(double)*2*N1);
    tt = (double*)malloc(sizeof(double)*N1);
    XX = (double*)malloc(sizeof(double)*2*N1);
    res = (double*)malloc(sizeof(double)*N1);
    tablep = (double*)malloc(sizeof(double)*pN);

    for(i = 0; i < 2;++i) {
        for(j = 0;j < N1;++j) {
            z[i*N1+j] = y[1+j-i];
        }
    } 

    yt = &z[0];
    yt1 = &z[N1];

    for(i = 1; i <= N1;++i) {
        tt[i-1] = (double)i - ((double)N1)/2.0;
    }

    p = 3;
    varcovar = (double*)malloc(sizeof(double)*p*p);

    memcpy(XX,tt,sizeof(double)*N1);
    memcpy(XX+N1,yt1,sizeof(double)*N1);

    at = 0.95;

    fit = reg_init(N1,p);

    //mdisplay(XX,2,N1);
    //mdisplay(yt,1,N1);

    regress(fit,XX,yt,res,varcovar,at);

    //summary(fit);
    //anova(fit);

    nssqr_res = 0.0;

    for(i =  0; i < N1;++i) {
        nssqr_res += (res[i]*res[i]);
    }

    nssqr_res /= ((double) N1);

    s2 = nssqr_res;

    if (lshort == 1) {
        l = (int) 4.0 * pow(((double) N1)/100.0,0.25);
    } else {
        l = (int) 12.0 * pow(((double) N1)/100.0,0.25);
    }

    if (klag != NULL && *klag > 0) {
        l = *klag;
    }

    ppsum(res,N1,l,&nssqr_res);

    sum_yt1 = sum_yt12 = sum_yt1n = 0.0;

    for(i = 0; i < N1;++i) {
        sum_yt1 += yt1[i];
        sum_yt12 += (yt1[i] * yt1[i]);
        sum_yt1n += (yt1[i] * (double) (i+1));
    }

    trm1 = N2 * (N2-1) *sum_yt12 / 12.0;
    trm2 = N1 * sum_yt1n * sum_yt1n;
    trm3 = N1 * (N1+1) * sum_yt1n * sum_yt1;
    trm4 = (N1 * (N1+1) * (2*N1+1) * sum_yt1 * sum_yt1) / 6.0;

    dx = trm1-trm2+trm3-trm4;

    //printf("dx %g \n",dx);    

    if (!strcmp(type,"Z(alpha)")) {
        table = &dftable[0];
        alpha = (fit->beta+2)->value;
        *statistic = (double) N1 * (alpha - 1.0) - ((double)N3 / (24.0 * dx)) * ((double)N3 * (nssqr_res - s2));
    } else if (!strcmp(type,"Z(t_alpha)")) {
        table = &dftable_at[0];
        tstat = ((fit->beta+2)->value - 1.0) / (fit->beta+2)->stdErr;
        *statistic = sqrt(s2)/sqrt(nssqr_res)*tstat - ((double) N3) / (4*sqrt(3.0)*sqrt(dx)*sqrt(nssqr_res))*(nssqr_res - s2);
    } else {
        printf(" Type only admits two values : Z(alpha) and Z(t_alpha) \n");
        exit(-1);
    }

    //printf("stat %g (fit->beta+2)->value %g \n",*statistic,(fit->beta+2)->value);

    //printf("\n ss1 %g ss2 %g \n",s2,nssqr_res);

    if (klag != NULL) *klag = l;

    
    for(i = 0; i < pN;++i) {
        iter = i * tN;
        tablep[i] = interpolate_linear(nT,table+iter,tN,(double)N1);
    }
    
    interp = interpolate_linear(tablep,prob,pN,*statistic);

    //printf("interp %g \n",interp);

    if (!strcmp(alternative,"stationary")) {
        *pval = interp;
    } else if (!strcmp(alternative,"explosive")) {
        *pval = 1.0 - interp;
    } else {
        printf("alternative accepts only two values - stationary and explosive \n");
        exit(-1);
    }

    

    free_reg(fit);
    free(z);
    free(tt);
    free(XX);
    free(varcovar);
    free(res);
    free(tablep);
}